

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.h
# Opt level: O0

Orphan<capnp::List<capnproto_test::capnp::test::TestMembrane::Thing,_(capnp::Kind)5>_> * __thiscall
capnp::
copyOutOfMembrane<capnp::List<capnproto_test::capnp::test::TestMembrane::Thing,(capnp::Kind)5>::Reader>
          (Orphan<capnp::List<capnproto_test::capnp::test::TestMembrane::Thing,_(capnp::Kind)5>_>
           *__return_storage_ptr__,capnp *this,Reader *from,Orphanage to,
          Own<capnp::MembranePolicy> *policy)

{
  ListReader from_00;
  Orphanage to_00;
  Own<capnp::MembranePolicy> *other;
  Own<capnp::MembranePolicy> local_a8;
  BuilderArena *local_98;
  BuilderArena *pBStack_90;
  ListReader local_80;
  OrphanBuilder local_50;
  Own<capnp::MembranePolicy> *local_30;
  Own<capnp::MembranePolicy> *policy_local;
  Reader *from_local;
  Orphanage to_local;
  
  to_local.arena = to.arena;
  local_30 = (Own<capnp::MembranePolicy> *)to.capTable;
  policy_local = (Own<capnp::MembranePolicy> *)this;
  from_local = from;
  to_local.capTable = (CapTableBuilder *)__return_storage_ptr__;
  _::
  PointerHelpers<capnp::List<capnproto_test::capnp::test::TestMembrane::Thing,_(capnp::Kind)5>,_(capnp::Kind)6>
  ::getInternalReader(&local_80,(Reader *)this);
  local_98 = (BuilderArena *)from_local;
  pBStack_90 = to_local.arena;
  other = kj::mv<kj::Own<capnp::MembranePolicy>>((Own<capnp::MembranePolicy> *)to.capTable);
  kj::Own<capnp::MembranePolicy>::Own(&local_a8,other);
  to_00.capTable = (CapTableBuilder *)pBStack_90;
  to_00.arena = local_98;
  from_00.capTable = local_80.capTable;
  from_00.segment = local_80.segment;
  from_00.ptr = local_80.ptr;
  from_00.elementCount = local_80.elementCount;
  from_00.step = local_80.step;
  from_00.structDataSize = local_80.structDataSize;
  from_00.structPointerCount = local_80.structPointerCount;
  from_00.elementSize = local_80.elementSize;
  from_00._39_1_ = local_80._39_1_;
  from_00.nestingLimit = local_80.nestingLimit;
  from_00._44_4_ = local_80._44_4_;
  _::copyOutOfMembrane(&local_50,from_00,to_00,&local_a8,false);
  Orphan<capnp::List<capnproto_test::capnp::test::TestMembrane::Thing,_(capnp::Kind)5>_>::Orphan
            (__return_storage_ptr__,&local_50);
  _::OrphanBuilder::~OrphanBuilder(&local_50);
  kj::Own<capnp::MembranePolicy>::~Own(&local_a8);
  return __return_storage_ptr__;
}

Assistant:

Orphan<typename kj::Decay<Reader>::Reads> copyOutOfMembrane(
    Reader&& from, Orphanage to, kj::Own<MembranePolicy> policy) {
  return _::copyOutOfMembrane(
      _::PointerHelpers<typename kj::Decay<Reader>::Reads>::getInternalReader(from),
      to, kj::mv(policy), false);
}